

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::writeTrailer
          (QPDFWriter *this,trailer_e which,int size,bool xref_stream,qpdf_offset_t prev,
          int linearization_pass)

{
  qpdf_offset_t qVar1;
  bool bVar2;
  qpdf_offset_t qVar3;
  size_t nspaces;
  ulong uVar4;
  long lVar5;
  element_type *peVar6;
  string_view sVar7;
  string_view local_460;
  string_view local_450;
  string_view local_440;
  string_view local_430;
  string local_420;
  string_view local_400;
  string_view local_3f0;
  string_view local_3e0;
  string local_3d0;
  QPDF_String local_3b0;
  string local_390;
  string_view local_370;
  string local_360;
  QPDF_String local_340;
  string local_320;
  string_view local_300;
  string_view local_2f0;
  string_view local_2e0;
  string_view local_2d0;
  ulong local_2c0;
  size_t i;
  QPDF_String local_298;
  string local_278;
  ulong local_258;
  size_t len;
  string_view local_240;
  undefined1 local_230 [8];
  string original_id1;
  string_view local_200;
  string_view local_1f0;
  QPDFObjectHandle local_1e0;
  long local_1d0;
  string local_1c8;
  string_view local_1a8;
  qpdf_offset_t local_198;
  qpdf_offset_t pos;
  string local_180;
  string_view local_160;
  string_view local_150;
  string local_140;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  BaseHandle *local_f0;
  type *value;
  type *key;
  _Self local_d8;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  string_view local_90;
  string_view local_80;
  string_view local_70 [2];
  string_view local_50;
  undefined1 local_40 [8];
  QPDFObjectHandle trailer;
  int linearization_pass_local;
  qpdf_offset_t prev_local;
  bool xref_stream_local;
  int size_local;
  trailer_e which_local;
  QPDFWriter *this_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = linearization_pass;
  getTrimmedTrailer((QPDFWriter *)local_40);
  if (xref_stream) {
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    std::__cxx11::string::clear();
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"trailer <<")
    ;
    writeString(this,local_50);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_70,"\n");
  writeStringQDF(this,local_70[0]);
  if (which == t_lin_second) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80," /Size ");
    writeString(this,local_80);
    std::__cxx11::to_string((string *)&__range2,size);
    local_90 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range2);
    writeString(this,local_90);
    std::__cxx11::string::~string((string *)&__range2);
  }
  else {
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin2,(typed)local_40);
    __end2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin2);
    local_d8._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin2);
    while( true ) {
      bVar2 = std::operator!=(&__end2,&local_d8);
      if (!bVar2) break;
      key = &std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end2)->first;
      value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
      local_f0 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                              *)key)->super_BaseHandle;
      bVar2 = ::qpdf::BaseHandle::null(local_f0);
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"  ");
        writeStringQDF(this,local_100);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110," ");
        writeStringNoQDF(this,local_110);
        ::qpdf::Name::normalize(&local_140,(string *)value);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_140);
        local_120 = sVar7;
        writeString(this,sVar7);
        std::__cxx11::string::~string((string *)&local_140);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150," ");
        writeString(this,local_150);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value,"/Size");
        if (bVar2) {
          std::__cxx11::to_string(&local_180,size);
          sVar7 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_180);
          local_160 = sVar7;
          writeString(this,sVar7);
          std::__cxx11::string::~string((string *)&local_180);
          if (which == t_lin_first) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pos," /Prev ");
            writeString(this,_pos);
            peVar6 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            local_198 = ::qpdf::pl::Count::getCount(peVar6->pipeline);
            std::__cxx11::to_string(&local_1c8,prev);
            sVar7 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c8);
            local_1a8 = sVar7;
            writeString(this,sVar7);
            std::__cxx11::string::~string((string *)&local_1c8);
            qVar1 = local_198;
            peVar6 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            qVar3 = ::qpdf::pl::Count::getCount(peVar6->pipeline);
            local_1d0 = (qVar1 - qVar3) + 0x15;
            nspaces = QIntC::to_size<long_long>(&local_1d0);
            writePad(this,nspaces);
          }
        }
        else {
          QPDFObjectHandle::QPDFObjectHandle(&local_1e0,(QPDFObjectHandle *)local_f0);
          unparseChild(this,&local_1e0,1,0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"\n");
        writeStringQDF(this,local_1f0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200," ");
  writeStringQDF(this,local_200);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&original_id1.field_2 + 8),
             " /ID [");
  writeString(this,stack0xfffffffffffffdf0);
  if (trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ == 1) {
    getOriginalID1_abi_cxx11_((string *)local_230,this);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&len,"<");
      writeString(this,_len);
      std::__cxx11::string::string((string *)&i,(string *)local_230);
      QPDF_String::QPDF_String(&local_298,(string *)&i);
      QPDF_String::unparse_abi_cxx11_(&local_278,&local_298,true);
      lVar5 = std::__cxx11::string::length();
      std::__cxx11::string::~string((string *)&local_278);
      QPDF_String::~QPDF_String(&local_298);
      std::__cxx11::string::~string((string *)&i);
      local_258 = lVar5 - 2;
      for (local_2c0 = 0; local_2c0 < local_258; local_2c0 = local_2c0 + 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,"0");
        writeString(this,local_2d0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e0,">");
      writeString(this,local_2e0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_240,"<00000000000000000000000000000000>");
      writeString(this,local_240);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2f0,"<00000000000000000000000000000000>");
    writeString(this,local_2f0);
    std::__cxx11::string::~string((string *)local_230);
  }
  else {
    if (trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ == 0) {
      peVar6 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar6->deterministic_id & 1U) != 0) {
        computeDeterministicIDData(this);
      }
    }
    generateID(this);
    peVar6 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::string((string *)&local_360,(string *)&peVar6->id1);
    QPDF_String::QPDF_String(&local_340,&local_360);
    QPDF_String::unparse_abi_cxx11_(&local_320,&local_340,true);
    local_300 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_320);
    writeString(this,local_300);
    std::__cxx11::string::~string((string *)&local_320);
    QPDF_String::~QPDF_String(&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    peVar6 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::string((string *)&local_3d0,(string *)&peVar6->id2);
    QPDF_String::QPDF_String(&local_3b0,&local_3d0);
    QPDF_String::unparse_abi_cxx11_(&local_390,&local_3b0,true);
    local_370 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_390);
    writeString(this,local_370);
    std::__cxx11::string::~string((string *)&local_390);
    QPDF_String::~QPDF_String(&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e0,"]");
  writeString(this,local_3e0);
  if (which != t_lin_second) {
    peVar6 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar6->encrypted & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3f0," /Encrypt ");
      writeString(this,local_3f0);
      peVar6 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::__cxx11::to_string(&local_420,peVar6->encryption_dict_objid);
      local_400 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_420);
      writeString(this,local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_430," 0 R");
      writeString(this,local_430);
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440,"\n");
  writeStringQDF(this,local_440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_450," ");
  writeStringNoQDF(this,local_450);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_460,">>");
  writeString(this,local_460);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  return;
}

Assistant:

void
QPDFWriter::writeTrailer(
    trailer_e which, int size, bool xref_stream, qpdf_offset_t prev, int linearization_pass)
{
    QPDFObjectHandle trailer = getTrimmedTrailer();
    if (xref_stream) {
        m->cur_data_key.clear();
    } else {
        writeString("trailer <<");
    }
    writeStringQDF("\n");
    if (which == t_lin_second) {
        writeString(" /Size ");
        writeString(std::to_string(size));
    } else {
        for (auto const& [key, value]: trailer.as_dictionary()) {
            if (value.null()) {
                continue;
            }
            writeStringQDF("  ");
            writeStringNoQDF(" ");
            writeString(Name::normalize(key));
            writeString(" ");
            if (key == "/Size") {
                writeString(std::to_string(size));
                if (which == t_lin_first) {
                    writeString(" /Prev ");
                    qpdf_offset_t pos = m->pipeline->getCount();
                    writeString(std::to_string(prev));
                    writePad(QIntC::to_size(pos - m->pipeline->getCount() + 21));
                }
            } else {
                unparseChild(value, 1, 0);
            }
            writeStringQDF("\n");
        }
    }

    // Write ID
    writeStringQDF(" ");
    writeString(" /ID [");
    if (linearization_pass == 1) {
        std::string original_id1 = getOriginalID1();
        if (original_id1.empty()) {
            writeString("<00000000000000000000000000000000>");
        } else {
            // Write a string of zeroes equal in length to the representation of the original ID.
            // While writing the original ID would have the same number of bytes, it would cause a
            // change to the deterministic ID generated by older versions of the software that
            // hard-coded the length of the ID to 16 bytes.
            writeString("<");
            size_t len = QPDF_String(original_id1).unparse(true).length() - 2;
            for (size_t i = 0; i < len; ++i) {
                writeString("0");
            }
            writeString(">");
        }
        writeString("<00000000000000000000000000000000>");
    } else {
        if ((linearization_pass == 0) && (m->deterministic_id)) {
            computeDeterministicIDData();
        }
        generateID();
        writeString(QPDF_String(m->id1).unparse(true));
        writeString(QPDF_String(m->id2).unparse(true));
    }
    writeString("]");

    if (which != t_lin_second) {
        // Write reference to encryption dictionary
        if (m->encrypted) {
            writeString(" /Encrypt ");
            writeString(std::to_string(m->encryption_dict_objid));
            writeString(" 0 R");
        }
    }

    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>");
}